

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

char * google::protobuf::internal::WireFormat::_InternalParseAndMergeField
                 (Message *msg,char *ptr,ParseContext *ctx,uint64_t tag,Reflection *reflection,
                 FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  MessageFactory *pMVar2;
  unsigned_long *puVar3;
  anon_class_32_4_91646d40 add;
  anon_class_32_4_91646d40 add_00;
  anon_class_32_4_91646d40 add_01;
  bool bVar4;
  bool bVar5;
  Type TVar6;
  uint32_t uVar7;
  UnknownFieldSet *unknown;
  char *pcVar8;
  Message *msg_00;
  MessageLite *msg_01;
  RepeatedField<int> *pRVar9;
  RepeatedField<unsigned_int> *pRVar10;
  RepeatedField<bool> *object;
  RepeatedField<double> *object_00;
  RepeatedField<float> *object_01;
  RepeatedField<long> *pRVar11;
  RepeatedField<unsigned_long> *pRVar12;
  LogMessage *pLVar13;
  string *value_00;
  int iVar14;
  char *end;
  uint uVar15;
  int iVar16;
  long lVar17;
  char *local_e8;
  LogFinisher local_d9;
  uint32_t value;
  char *pcStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [3];
  char *local_98;
  RepeatedField<int> *local_90;
  FieldDescriptor *pFStack_88;
  Reflection *local_80;
  Message *pMStack_78;
  string local_70;
  string local_50;
  
  local_e8 = ptr;
  if (field == (FieldDescriptor *)0x0) {
LAB_003b73d7:
    unknown = Reflection::MutableUnknownFields(reflection,msg);
    pcVar8 = UnknownFieldParse(tag,unknown,ptr,ctx);
    return pcVar8;
  }
  uVar15 = (uint)tag & 7;
  TVar6 = FieldDescriptor::type(field);
  if (uVar15 != *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)TVar6 * 4)) {
    bVar5 = FieldDescriptor::is_packable(field);
    if (uVar15 != 2 || !bVar5) goto LAB_003b73d7;
    TVar6 = FieldDescriptor::type(field);
    switch(TVar6) {
    case TYPE_DOUBLE:
      object_00 = Reflection::MutableRepeatedFieldInternal<double>(reflection,msg,field);
      pcVar8 = PackedDoubleParser(object_00,ptr,ctx);
      return pcVar8;
    case TYPE_FLOAT:
      object_01 = Reflection::MutableRepeatedFieldInternal<float>(reflection,msg,field);
      pcVar8 = PackedFloatParser(object_01,ptr,ctx);
      return pcVar8;
    case TYPE_INT64:
      pRVar11 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
      pcVar8 = PackedInt64Parser(pRVar11,ptr,ctx);
      return pcVar8;
    case TYPE_UINT64:
      pRVar12 = Reflection::MutableRepeatedFieldInternal<unsigned_long>(reflection,msg,field);
      pcVar8 = PackedUInt64Parser(pRVar12,ptr,ctx);
      return pcVar8;
    case TYPE_INT32:
      pRVar9 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      pcVar8 = PackedInt32Parser(pRVar9,ptr,ctx);
      return pcVar8;
    case TYPE_FIXED64:
      pRVar12 = Reflection::MutableRepeatedFieldInternal<unsigned_long>(reflection,msg,field);
      pcVar8 = PackedFixed64Parser(pRVar12,ptr,ctx);
      return pcVar8;
    case TYPE_FIXED32:
      pRVar10 = Reflection::MutableRepeatedFieldInternal<unsigned_int>(reflection,msg,field);
      pcVar8 = PackedFixed32Parser(pRVar10,ptr,ctx);
      return pcVar8;
    case TYPE_BOOL:
      object = Reflection::MutableRepeatedFieldInternal<bool>(reflection,msg,field);
      pcVar8 = PackedBoolParser(object,ptr,ctx);
      return pcVar8;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      LogMessage::LogMessage
                ((LogMessage *)&value,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
                 ,0x372);
      pLVar13 = LogMessage::operator<<((LogMessage *)&value,"Can\'t reach");
      LogFinisher::operator=((LogFinisher *)&local_90,pLVar13);
      LogMessage::~LogMessage((LogMessage *)&value);
      return (char *)0x0;
    case TYPE_UINT32:
      pRVar10 = Reflection::MutableRepeatedFieldInternal<unsigned_int>(reflection,msg,field);
      pcVar8 = PackedUInt32Parser(pRVar10,ptr,ctx);
      return pcVar8;
    case TYPE_ENUM:
      local_90 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      if (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x03') {
        pcVar8 = PackedEnumParser(local_90,ptr,ctx);
        return pcVar8;
      }
      local_98 = ptr;
      pFStack_88 = field;
      local_80 = reflection;
      pMStack_78 = msg;
      uVar7 = ReadSize(&local_98);
      if (local_98 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar8 = (ctx->super_EpsCopyInputStream).buffer_end_;
      lVar17 = (long)pcVar8 - (long)local_98;
      while( true ) {
        iVar16 = (int)lVar17;
        iVar14 = uVar7 - iVar16;
        if (iVar14 == 0 || (int)uVar7 < iVar16) {
          end = local_98 + (int)uVar7;
          add_00.field = pFStack_88;
          add_00.rep_enum = local_90;
          add_00.reflection = local_80;
          add_00.msg = pMStack_78;
          pcVar8 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                             (local_98,end,add_00);
          if (end == pcVar8) {
            return pcVar8;
          }
          return (char *)0x0;
        }
        add.field = pFStack_88;
        add.rep_enum = local_90;
        add.reflection = local_80;
        add.msg = pMStack_78;
        local_98 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                             (local_98,pcVar8,add);
        if (local_98 == (char *)0x0) {
          return (char *)0x0;
        }
        uVar15 = (int)local_98 - (int)(ctx->super_EpsCopyInputStream).buffer_end_;
        if (0x10 < uVar15) {
          LogMessage::LogMessage
                    ((LogMessage *)&value,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
                     ,0x2f2);
          pLVar13 = LogMessage::operator<<
                              ((LogMessage *)&value,
                               "CHECK failed: overrun >= 0 && overrun <= kSlopBytes: ");
          LogFinisher::operator=(&local_d9,pLVar13);
          LogMessage::~LogMessage((LogMessage *)&value);
        }
        if (iVar14 < 0x11) {
          local_c8[0]._8_2_ = 0;
          local_c8[0]._M_allocated_capacity = 0;
          puVar3 = (unsigned_long *)(ctx->super_EpsCopyInputStream).buffer_end_;
          _value = (pointer)*puVar3;
          pcStack_d0 = (char *)puVar3[1];
          add_01.field = pFStack_88;
          add_01.rep_enum = local_90;
          add_01.reflection = local_80;
          add_01.msg = pMStack_78;
          pcVar8 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                             ((char *)((long)&value + (long)(int)uVar15),
                              (char *)((long)&value + (long)iVar14),add_01);
          if (pcVar8 == (char *)((long)&value + (long)iVar14)) {
            return (ctx->super_EpsCopyInputStream).buffer_end_ + ((long)pcVar8 - (long)&value);
          }
          return (char *)0x0;
        }
        uVar7 = uVar7 - (iVar16 + uVar15);
        if ((int)uVar7 < 1) {
          LogMessage::LogMessage
                    ((LogMessage *)&value,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
                     ,0x300);
          pLVar13 = LogMessage::operator<<((LogMessage *)&value,"CHECK failed: (size) > (0): ");
          LogFinisher::operator=(&local_d9,pLVar13);
          LogMessage::~LogMessage((LogMessage *)&value);
        }
        if ((ctx->super_EpsCopyInputStream).limit_ < 0x11) break;
        local_98 = EpsCopyInputStream::Next(&ctx->super_EpsCopyInputStream);
        if (local_98 == (char *)0x0) {
          return (char *)0x0;
        }
        local_98 = local_98 + (int)uVar15;
        pcVar8 = (ctx->super_EpsCopyInputStream).buffer_end_;
        lVar17 = (long)pcVar8 - (long)local_98;
      }
      return (char *)0x0;
    case TYPE_SFIXED32:
      pRVar9 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      pcVar8 = PackedSFixed32Parser(pRVar9,ptr,ctx);
      return pcVar8;
    case TYPE_SFIXED64:
      pRVar11 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
      pcVar8 = PackedSFixed64Parser(pRVar11,ptr,ctx);
      return pcVar8;
    case TYPE_SINT32:
      pRVar9 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      pcVar8 = PackedSInt32Parser(pRVar9,ptr,ctx);
      return pcVar8;
    case MAX_TYPE:
      pRVar11 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
      pcVar8 = PackedSInt64Parser(pRVar11,ptr,ctx);
      return pcVar8;
    }
  }
  TVar6 = FieldDescriptor::type(field);
  bVar5 = false;
  switch(TVar6) {
  case TYPE_DOUBLE:
    if ((~(byte)field[1] & 0x60) != 0) {
      Reflection::SetDouble(reflection,msg,field,*(double *)ptr);
      return ptr + 8;
    }
    Reflection::AddDouble(reflection,msg,field,*(double *)ptr);
    return ptr + 8;
  case TYPE_FLOAT:
    if ((~(byte)field[1] & 0x60) != 0) {
      Reflection::SetFloat(reflection,msg,field,*(float *)ptr);
      return ptr + 4;
    }
    Reflection::AddFloat(reflection,msg,field,*(float *)ptr);
    return ptr + 4;
  case TYPE_INT64:
    local_e8 = VarintParse<unsigned_long>(ptr,(unsigned_long *)&value);
    if (local_e8 != (char *)0x0) {
      FVar1 = field[1];
joined_r0x003b7653:
      if ((~(byte)FVar1 & 0x60) == 0) {
        Reflection::AddInt64(reflection,msg,field,(int64_t)_value);
        return local_e8;
      }
      Reflection::SetInt64(reflection,msg,field,(int64_t)_value);
      return local_e8;
    }
    break;
  case TYPE_UINT64:
    local_e8 = VarintParse<unsigned_long>(ptr,(unsigned_long *)&value);
    if (local_e8 != (char *)0x0) {
      if ((~(byte)field[1] & 0x60) != 0) {
        Reflection::SetUInt64(reflection,msg,field,(uint64_t)_value);
        return local_e8;
      }
      Reflection::AddUInt64(reflection,msg,field,(uint64_t)_value);
      return local_e8;
    }
    break;
  case TYPE_INT32:
    local_e8 = VarintParse<unsigned_int>(ptr,&value);
    if (local_e8 != (char *)0x0) {
      FVar1 = field[1];
joined_r0x003b7421:
      if ((~(byte)FVar1 & 0x60) == 0) {
        Reflection::AddInt32(reflection,msg,field,value);
        return local_e8;
      }
      Reflection::SetInt32(reflection,msg,field,value);
      return local_e8;
    }
    break;
  case TYPE_FIXED64:
    if ((~(byte)field[1] & 0x60) != 0) {
      Reflection::SetUInt64(reflection,msg,field,*(uint64_t *)ptr);
      return ptr + 8;
    }
    Reflection::AddUInt64(reflection,msg,field,*(uint64_t *)ptr);
    return ptr + 8;
  case TYPE_FIXED32:
    if ((~(byte)field[1] & 0x60) != 0) {
      Reflection::SetUInt32(reflection,msg,field,*(uint32_t *)ptr);
      return ptr + 4;
    }
    Reflection::AddUInt32(reflection,msg,field,*(uint32_t *)ptr);
    return ptr + 4;
  case TYPE_BOOL:
    local_e8 = VarintParse<unsigned_long>(ptr,(unsigned_long *)&value);
    if (local_e8 != (char *)0x0) {
      if ((~(byte)field[1] & 0x60) != 0) {
        Reflection::SetBool(reflection,msg,field,_value != (pointer)0x0);
        return local_e8;
      }
      Reflection::AddBool(reflection,msg,field,_value != (pointer)0x0);
      return local_e8;
    }
    break;
  case TYPE_STRING:
    bVar5 = *(char *)(*(long *)(field + 0x10) + 0x3a) == '\x03';
    bVar4 = true;
    goto LAB_003b7739;
  case TYPE_GROUP:
    pMVar2 = (ctx->data_).factory;
    if ((~(byte)field[1] & 0x60) == 0) {
      msg_00 = Reflection::AddMessage(reflection,msg,field,pMVar2);
    }
    else {
      msg_00 = Reflection::MutableMessage(reflection,msg,field,pMVar2);
    }
    pcVar8 = ParseContext::ParseGroup<google::protobuf::Message>(ctx,msg_00,ptr,(uint)tag);
    return pcVar8;
  case TYPE_MESSAGE:
    pMVar2 = (ctx->data_).factory;
    if ((~(byte)field[1] & 0x60) == 0) {
      msg_01 = &Reflection::AddMessage(reflection,msg,field,pMVar2)->super_MessageLite;
    }
    else {
      msg_01 = &Reflection::MutableMessage(reflection,msg,field,pMVar2)->super_MessageLite;
    }
    pcVar8 = ParseContext::ParseMessage(ctx,msg_01,ptr);
    return pcVar8;
  case TYPE_BYTES:
    bVar4 = false;
LAB_003b7739:
    uVar7 = ReadSize(&local_e8);
    if (local_e8 == (char *)0x0) {
      return (char *)0x0;
    }
    pcStack_d0 = (char *)0x0;
    local_c8[0]._M_allocated_capacity = local_c8[0]._M_allocated_capacity & 0xffffffffffffff00;
    _value = (pointer)local_c8;
    local_e8 = EpsCopyInputStream::ReadString
                         (&ctx->super_EpsCopyInputStream,local_e8,uVar7,(string *)&value);
    if (local_e8 == (char *)0x0) {
LAB_003b77ae:
      pcVar8 = (char *)0x0;
    }
    else {
      if (bVar4) {
        if (bVar5) {
          bVar5 = WireFormatLite::VerifyUtf8String
                            (_value,(int)pcStack_d0,PARSE,*(char **)(*(long *)(field + 8) + 0x20));
          if (!bVar5) goto LAB_003b77ae;
        }
        else {
          WireFormatLite::VerifyUtf8String
                    (_value,(int)pcStack_d0,PARSE,*(char **)(*(long *)(field + 8) + 0x20));
        }
      }
      if ((~(byte)field[1] & 0x60) == 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_value != local_c8) {
          local_50._M_dataplus._M_p = _value;
        }
        local_50.field_2._M_allocated_capacity = local_c8[0]._M_allocated_capacity;
        value_00 = &local_50;
        local_50._M_string_length = (size_type)pcStack_d0;
        pcStack_d0 = (char *)0x0;
        local_c8[0]._M_allocated_capacity = (ulong)(uint7)local_c8[0]._1_7_ << 8;
        _value = (pointer)local_c8;
        Reflection::AddString(reflection,msg,field,value_00);
      }
      else {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_value != local_c8) {
          local_70._M_dataplus._M_p = _value;
        }
        local_70.field_2._M_allocated_capacity = local_c8[0]._M_allocated_capacity;
        value_00 = &local_70;
        local_70._M_string_length = (size_type)pcStack_d0;
        pcStack_d0 = (char *)0x0;
        local_c8[0]._M_allocated_capacity = (ulong)(uint7)local_c8[0]._1_7_ << 8;
        _value = (pointer)local_c8;
        Reflection::SetString(reflection,msg,field,value_00);
      }
      std::__cxx11::string::~string((string *)value_00);
      pcVar8 = local_e8;
    }
    std::__cxx11::string::~string((string *)&value);
    return pcVar8;
  case TYPE_UINT32:
    local_e8 = VarintParse<unsigned_int>(ptr,&value);
    if (local_e8 != (char *)0x0) {
      if ((~(byte)field[1] & 0x60) != 0) {
        Reflection::SetUInt32(reflection,msg,field,value);
        return local_e8;
      }
      Reflection::AddUInt32(reflection,msg,field,value);
      return local_e8;
    }
    break;
  case TYPE_ENUM:
    local_e8 = VarintParse<unsigned_int>(ptr,&value);
    if (local_e8 != (char *)0x0) {
      if ((~(byte)field[1] & 0x60) != 0) {
        Reflection::SetEnumValue(reflection,msg,field,value);
        return local_e8;
      }
      Reflection::AddEnumValue(reflection,msg,field,value);
      return local_e8;
    }
    break;
  case TYPE_SFIXED32:
    if ((~(byte)field[1] & 0x60) != 0) {
      Reflection::SetInt32(reflection,msg,field,*(int32_t *)ptr);
      return ptr + 4;
    }
    Reflection::AddInt32(reflection,msg,field,*(int32_t *)ptr);
    return ptr + 4;
  case TYPE_SFIXED64:
    if ((~(byte)field[1] & 0x60) != 0) {
      Reflection::SetInt64(reflection,msg,field,*(int64_t *)ptr);
      return ptr + 8;
    }
    Reflection::AddInt64(reflection,msg,field,*(int64_t *)ptr);
    return ptr + 8;
  case TYPE_SINT32:
    value = ReadVarintZigZag32(&local_e8);
    if (local_e8 != (char *)0x0) {
      FVar1 = field[1];
      goto joined_r0x003b7421;
    }
    break;
  case MAX_TYPE:
    _value = (pointer)ReadVarintZigZag64(&local_e8);
    if (local_e8 != (char *)0x0) {
      FVar1 = field[1];
      goto joined_r0x003b7653;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* WireFormat::_InternalParseAndMergeField(
    Message* msg, const char* ptr, internal::ParseContext* ctx, uint64_t tag,
    const Reflection* reflection, const FieldDescriptor* field) {
  if (field == nullptr) {
    // unknown field set parser takes 64bit tags, because message set type ids
    // span the full 32 bit range making the tag span [0, 2^35) range.
    return internal::UnknownFieldParse(
        tag, reflection->MutableUnknownFields(msg), ptr, ctx);
  }
  if (WireFormatLite::GetTagWireType(tag) !=
      WireTypeForFieldType(field->type())) {
    if (field->is_packable() && WireFormatLite::GetTagWireType(tag) ==
                                    WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    ptr = internal::Packed##CPPTYPE_METHOD##Parser(                         \
        reflection->MutableRepeatedFieldInternal<CPPTYPE>(msg, field), ptr, \
        ctx);                                                               \
    return ptr;                                                             \
  }

        HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
        HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
        HANDLE_PACKED_TYPE(SINT32, int32_t, SInt32)
        HANDLE_PACKED_TYPE(SINT64, int64_t, SInt64)
        HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
        HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

        HANDLE_PACKED_TYPE(FIXED32, uint32_t, Fixed32)
        HANDLE_PACKED_TYPE(FIXED64, uint64_t, Fixed64)
        HANDLE_PACKED_TYPE(SFIXED32, int32_t, SFixed32)
        HANDLE_PACKED_TYPE(SFIXED64, int64_t, SFixed64)

        HANDLE_PACKED_TYPE(FLOAT, float, Float)
        HANDLE_PACKED_TYPE(DOUBLE, double, Double)

        HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

        case FieldDescriptor::TYPE_ENUM: {
          auto rep_enum =
              reflection->MutableRepeatedFieldInternal<int>(msg, field);
          bool open_enum = false;
          if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3 ||
              open_enum) {
            ptr = internal::PackedEnumParser(rep_enum, ptr, ctx);
          } else {
            return ctx->ReadPackedVarint(
                ptr, [rep_enum, field, reflection, msg](uint64_t val) {
                  if (field->enum_type()->FindValueByNumber(val) != nullptr) {
                    rep_enum->Add(val);
                  } else {
                    WriteVarint(field->number(), val,
                                reflection->MutableUnknownFields(msg));
                  }
                });
          }
          return ptr;
        }

        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE:
        case FieldDescriptor::TYPE_BYTES:
          GOOGLE_LOG(FATAL) << "Can't reach";
          return nullptr;
      }
    } else {
      // mismatched wiretype;
      return internal::UnknownFieldParse(
          tag, reflection->MutableUnknownFields(msg), ptr, ctx);
    }
  }

  // Non-packed value
  bool utf8_check = false;
  bool strict_utf8_check = false;
  switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    ptr = VarintParse(ptr, &value);                       \
    if (ptr == nullptr) return nullptr;                   \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

    HANDLE_TYPE(BOOL, uint64_t, Bool)
    HANDLE_TYPE(INT32, uint32_t, Int32)
    HANDLE_TYPE(INT64, uint64_t, Int64)
    HANDLE_TYPE(UINT32, uint32_t, UInt32)
    HANDLE_TYPE(UINT64, uint64_t, UInt64)

    case FieldDescriptor::TYPE_SINT32: {
      int32_t value = ReadVarintZigZag32(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt32(msg, field, value);
      } else {
        reflection->SetInt32(msg, field, value);
      }
      return ptr;
    }
    case FieldDescriptor::TYPE_SINT64: {
      int64_t value = ReadVarintZigZag64(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt64(msg, field, value);
      } else {
        reflection->SetInt64(msg, field, value);
      }
      return ptr;
    }
#undef HANDLE_TYPE
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    value = UnalignedLoad<CPPTYPE>(ptr);                  \
    ptr += sizeof(CPPTYPE);                               \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

#undef HANDLE_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      uint32_t value;
      ptr = VarintParse(ptr, &value);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddEnumValue(msg, field, value);
      } else {
        reflection->SetEnumValue(msg, field, value);
      }
      return ptr;
    }

    // Handle strings separately so that we can optimize the ctype=CORD case.
    case FieldDescriptor::TYPE_STRING:
      utf8_check = true;
      strict_utf8_check = StrictUtf8Check(field);
      PROTOBUF_FALLTHROUGH_INTENDED;
    case FieldDescriptor::TYPE_BYTES: {
      int size = ReadSize(&ptr);
      if (ptr == nullptr) return nullptr;
      std::string value;
      ptr = ctx->ReadString(ptr, size, &value);
      if (ptr == nullptr) return nullptr;
      if (utf8_check) {
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name().c_str())) {
            return nullptr;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
      }
      if (field->is_repeated()) {
        reflection->AddString(msg, field, std::move(value));
      } else {
        reflection->SetString(msg, field, std::move(value));
      }
      return ptr;
    }

    case FieldDescriptor::TYPE_GROUP: {
      Message* sub_message;
      if (field->is_repeated()) {
        sub_message = reflection->AddMessage(msg, field, ctx->data().factory);
      } else {
        sub_message =
            reflection->MutableMessage(msg, field, ctx->data().factory);
      }

      return ctx->ParseGroup(sub_message, ptr, tag);
    }

    case FieldDescriptor::TYPE_MESSAGE: {
      Message* sub_message;
      if (field->is_repeated()) {
        sub_message = reflection->AddMessage(msg, field, ctx->data().factory);
      } else {
        sub_message =
            reflection->MutableMessage(msg, field, ctx->data().factory);
      }
      return ctx->ParseMessage(sub_message, ptr);
    }
  }

  // GCC 8 complains about control reaching end of non-void function here.
  // Let's keep it happy by returning a nullptr.
  return nullptr;
}